

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_line_to_quad<charls::transform_hp1<unsigned_char>::inverse,unsigned_char>
               (uchar *source,size_t pixel_stride_in,quad<unsigned_char> *destination,
               size_t pixel_stride,inverse *transform)

{
  byte bVar1;
  size_t sVar2;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  if (pixel_stride != 0) {
    sVar2 = 0;
    do {
      bVar1 = source[sVar2 + pixel_stride_in];
      destination[sVar2] =
           (quad<unsigned_char>)
           ((uint)source[sVar2 + pixel_stride_in * 3] << 0x18 |
           (uint)(byte)(source[sVar2] + bVar1 + 0x80) |
           (uint)bVar1 << 8 |
           (uint)(byte)(source[sVar2 + pixel_stride_in * 2] + bVar1 + 0x80) << 0x10);
      sVar2 = sVar2 + 1;
    } while (pixel_stride != sVar2);
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}